

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::Integrator::getSolution
          (Integrator *this,double time,VectorDynSize *solution)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  size_type sVar4;
  char *pcVar5;
  const_reference pvVar6;
  ostream *poVar7;
  char *pcVar8;
  pointer pSVar9;
  undefined8 in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  const_iterator iteration;
  ostringstream errorMsg;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  *in_stack_fffffffffffffdb0;
  __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
  *in_stack_fffffffffffffdb8;
  SolutionElement *local_1f0;
  __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
  local_1e8;
  SolutionElement *local_1e0;
  SolutionElement *local_1d8;
  __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
  local_1d0;
  string local_1c8 [48];
  ostringstream local_198 [376];
  undefined8 local_20;
  double local_18;
  byte local_1;
  
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  sVar4 = std::
          vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
          ::size((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                  *)(in_RDI + 4));
  dVar1 = local_18;
  if (sVar4 == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x2f539a);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar5,"getSolution","No solution computed yet.");
    local_1 = 0;
  }
  else {
    pvVar6 = std::
             vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
             ::front(in_stack_fffffffffffffdb0);
    dVar2 = local_18;
    if (pvVar6->time <= dVar1) {
      pvVar6 = std::
               vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
               ::back(in_stack_fffffffffffffdb0);
      if (dVar2 < pvVar6->time || dVar2 == pvVar6->time) {
        local_1d0._M_current =
             (SolutionElement *)
             std::
             vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
             ::cbegin((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                       *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        while( true ) {
          local_1d8 = (SolutionElement *)
                      __gnu_cxx::
                      __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                      ::operator+(in_stack_fffffffffffffdb8,
                                  (difference_type)in_stack_fffffffffffffdb0);
          local_1e0 = (SolutionElement *)
                      std::
                      vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                      ::cend((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                              *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                              *)in_stack_fffffffffffffdb0,
                             (__normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                              *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          if (!bVar3) break;
          pSVar9 = __gnu_cxx::
                   __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                   ::operator->(&local_1d0);
          in_stack_fffffffffffffdaf = false;
          if (pSVar9->time <= local_18) {
            local_1e8 = __gnu_cxx::
                        __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                        ::operator+(in_stack_fffffffffffffdb8,
                                    (difference_type)in_stack_fffffffffffffdb0);
            pSVar9 = __gnu_cxx::
                     __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                     ::operator->(&local_1e8);
            in_stack_fffffffffffffdaf = local_18 <= pSVar9->time;
          }
          if ((bool)in_stack_fffffffffffffdaf != false) {
            local_1f0 = (SolutionElement *)
                        __gnu_cxx::
                        __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
                        ::operator+(in_stack_fffffffffffffdb8,
                                    (difference_type)in_stack_fffffffffffffdb0);
            local_1 = (**(code **)(*in_RDI + 0x70))(local_18,in_RDI,&local_1d0,&local_1f0,local_20);
            local_1 = local_1 & 1;
            goto LAB_002f5742;
          }
          __gnu_cxx::
          __normal_iterator<const_iDynTree::optimalcontrol::integrators::SolutionElement_*,_std::vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>_>
          ::operator++(&local_1d0);
        }
        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x2f571c);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError(pcVar5,"getSolution","Error while searching the desired time.");
        local_1 = 0;
        goto LAB_002f5742;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"Time outside the computed range. ");
    poVar7 = std::operator<<((ostream *)local_198,"Valid range: [");
    pvVar6 = std::
             vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
             ::front(in_stack_fffffffffffffdb0);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar6->time);
    poVar7 = std::operator<<(poVar7,", ");
    pvVar6 = std::
             vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
             ::back(in_stack_fffffffffffffdb0);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar6->time);
    std::operator<<(poVar7,"]. ");
    poVar7 = std::operator<<((ostream *)local_198,"Requested value: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
    std::operator<<(poVar7,".");
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x2f552a);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar5,"getSolution",pcVar8);
    std::__cxx11::string::~string(local_1c8);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
LAB_002f5742:
  return (bool)(local_1 & 1);
}

Assistant:

bool Integrator::getSolution(double time, VectorDynSize &solution) const{
                if (m_solution.size() == 0){
                    reportError(m_info.name().c_str(), "getSolution", "No solution computed yet.");
                    return false;
                }

                if((time < m_solution.front().time)||(time > m_solution.back().time)){
                    std::ostringstream errorMsg;
                    errorMsg << "Time outside the computed range. ";
                    errorMsg << "Valid range: [" << m_solution.front().time << ", " << m_solution.back().time << "]. ";
                    errorMsg << "Requested value: " << time << ".";
                    reportError(m_info.name().c_str(), "getSolution", errorMsg.str().c_str());
                    return false;
                }

                for (std::vector<SolutionElement>::const_iterator iteration = m_solution.cbegin();
                     (iteration +1) != m_solution.cend(); ++iteration){

                    if ((iteration->time <= time) && ((iteration + 1)->time >= time)){
                        return interpolatePoints(iteration, iteration+1, time, solution);
                    }
                }

                reportError(m_info.name().c_str(), "getSolution", "Error while searching the desired time.");
                return false;
            }